

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::SetChunking(Segment *this,bool chunking,char *filename)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  void *pvVar3;
  char *in_RDX;
  byte in_SIL;
  long in_RDI;
  char *header;
  size_t header_length;
  size_t hdr_length;
  char *temp;
  size_t filename_length;
  MkvWriter *in_stack_ffffffffffffff30;
  MkvWriter *in_stack_ffffffffffffff38;
  MkvWriter *local_c0;
  void *local_b0;
  void *local_a0;
  char **in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Segment *in_stack_ffffffffffffffa8;
  
  if (0 < *(int *)(in_RDI + 200)) {
    return false;
  }
  if ((in_SIL & 1) != 0) {
    if (in_RDX == (char *)0x0) {
      return false;
    }
    if (((*(byte *)(in_RDI + 0xf0) & 1) != 0) &&
       (iVar2 = strcmp(in_RDX,*(char **)(in_RDI + 0xf8)), iVar2 == 0)) {
      return true;
    }
    __n = strlen(in_RDX);
    pvVar3 = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    if (pvVar3 == (void *)0x0) {
      return false;
    }
    memcpy(pvVar3,in_RDX,__n);
    *(undefined1 *)((long)pvVar3 + __n) = 0;
    if (*(void **)(in_RDI + 0xf8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0xf8));
    }
    *(void **)(in_RDI + 0xf8) = pvVar3;
    bVar1 = UpdateChunkName(in_stack_ffffffffffffffa8,
                            (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
    if (!bVar1) {
      return false;
    }
    if (*(long *)(in_RDI + 0xd8) == 0) {
      pvVar3 = operator_new(0x18,(nothrow_t *)&std::nothrow);
      local_a0 = (void *)0x0;
      if (pvVar3 != (void *)0x0) {
        MkvWriter::MkvWriter(in_stack_ffffffffffffff30);
        local_a0 = pvVar3;
      }
      *(void **)(in_RDI + 0xd8) = local_a0;
      if (*(long *)(in_RDI + 0xd8) == 0) {
        return false;
      }
    }
    if (*(long *)(in_RDI + 0xe0) == 0) {
      pvVar3 = operator_new(0x18,(nothrow_t *)&std::nothrow);
      local_b0 = (void *)0x0;
      if (pvVar3 != (void *)0x0) {
        MkvWriter::MkvWriter(in_stack_ffffffffffffff30);
        local_b0 = pvVar3;
      }
      *(void **)(in_RDI + 0xe0) = local_b0;
      if (*(long *)(in_RDI + 0xe0) == 0) {
        return false;
      }
    }
    if (*(long *)(in_RDI + 0xe8) == 0) {
      in_stack_ffffffffffffff38 = (MkvWriter *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      local_c0 = (MkvWriter *)0x0;
      if (in_stack_ffffffffffffff38 != (MkvWriter *)0x0) {
        MkvWriter::MkvWriter(in_stack_ffffffffffffff30);
        local_c0 = in_stack_ffffffffffffff38;
      }
      *(MkvWriter **)(in_RDI + 0xe8) = local_c0;
      if (*(long *)(in_RDI + 0xe8) == 0) {
        return false;
      }
    }
    bVar1 = MkvWriter::Open(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    if (!bVar1) {
      return false;
    }
    pvVar3 = operator_new__(__n + 5,(nothrow_t *)&std::nothrow);
    if (pvVar3 == (void *)0x0) {
      return false;
    }
    memcpy(pvVar3,*(void **)(in_RDI + 0xf8),__n);
    *(undefined4 *)((long)pvVar3 + __n) = 0x7264682e;
    *(undefined1 *)((long)pvVar3 + __n + 4) = 0;
    bVar1 = MkvWriter::Open(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    if (!bVar1) {
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
      return false;
    }
    *(undefined8 *)(in_RDI + 0x978) = *(undefined8 *)(in_RDI + 0xd8);
    *(undefined8 *)(in_RDI + 0x980) = *(undefined8 *)(in_RDI + 0xe0);
    *(undefined8 *)(in_RDI + 0x988) = *(undefined8 *)(in_RDI + 0xe8);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
  }
  *(byte *)(in_RDI + 0xf0) = in_SIL & 1;
  return true;
}

Assistant:

bool Segment::SetChunking(bool chunking, const char* filename) {
  if (chunk_count_ > 0)
    return false;

  if (chunking) {
    if (!filename)
      return false;

    // Check if we are being set to what is already set.
    if (chunking_ && !strcmp(filename, chunking_base_name_))
      return true;

    const size_t filename_length = strlen(filename);
    char* const temp = new (std::nothrow) char[filename_length + 1];  // NOLINT
    if (!temp)
      return false;

    memcpy(temp, filename, filename_length);
    temp[filename_length] = '\0';

    delete[] chunking_base_name_;
    chunking_base_name_ = temp;
    // From this point, strlen(chunking_base_name_) == filename_length

    if (!UpdateChunkName("chk", &chunk_name_))
      return false;

    if (!chunk_writer_cluster_) {
      chunk_writer_cluster_ = new (std::nothrow) MkvWriter();  // NOLINT
      if (!chunk_writer_cluster_)
        return false;
    }

    if (!chunk_writer_cues_) {
      chunk_writer_cues_ = new (std::nothrow) MkvWriter();  // NOLINT
      if (!chunk_writer_cues_)
        return false;
    }

    if (!chunk_writer_header_) {
      chunk_writer_header_ = new (std::nothrow) MkvWriter();  // NOLINT
      if (!chunk_writer_header_)
        return false;
    }

    if (!chunk_writer_cluster_->Open(chunk_name_))
      return false;

    const size_t hdr_length = strlen(".hdr");
    const size_t header_length = filename_length + hdr_length + 1;
    char* const header = new (std::nothrow) char[header_length];  // NOLINT
    if (!header)
      return false;

    memcpy(header, chunking_base_name_, filename_length);
    memcpy(&header[filename_length], ".hdr", hdr_length);
    header[filename_length + hdr_length] = '\0';

    if (!chunk_writer_header_->Open(header)) {
      delete[] header;
      return false;
    }

    writer_cluster_ = chunk_writer_cluster_;
    writer_cues_ = chunk_writer_cues_;
    writer_header_ = chunk_writer_header_;

    delete[] header;
  }

  chunking_ = chunking;

  return true;
}